

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O1

void __thiscall
vkt::shaderexecutor::
ApplyVar<vkt::shaderexecutor::Signature<tcu::Matrix<float,_2,_2>,_tcu::Matrix<float,_2,_2>,_tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
::ApplyVar(ApplyVar<vkt::shaderexecutor::Signature<tcu::Matrix<float,_2,_2>,_tcu::Matrix<float,_2,_2>,_tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
           *this,ApplyFunc *func,VariableP<tcu::Matrix<float,_2,_2>_> *arg0,
          VariableP<tcu::Matrix<float,_2,_2>_> *arg1,VariableP<vkt::shaderexecutor::Void> *arg2,
          VariableP<vkt::shaderexecutor::Void> *arg3)

{
  deInt32 *pdVar1;
  ExprP<vkt::shaderexecutor::Void> local_68;
  ExprP<vkt::shaderexecutor::Void> local_58;
  ExprP<tcu::Matrix<float,_2,_2>_> local_48;
  ExprP<tcu::Matrix<float,_2,_2>_> local_38;
  
  shaderexecutor::VariableP::operator_cast_to_ExprP((VariableP *)&local_38);
  shaderexecutor::VariableP::operator_cast_to_ExprP((VariableP *)&local_48);
  shaderexecutor::VariableP::operator_cast_to_ExprP((VariableP *)&local_58);
  shaderexecutor::VariableP::operator_cast_to_ExprP((VariableP *)&local_68);
  (this->
  super_Apply<vkt::shaderexecutor::Signature<tcu::Matrix<float,_2,_2>,_tcu::Matrix<float,_2,_2>,_tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  ).super_Expr<tcu::Matrix<float,_2,_2>_>.super_ExprBase._vptr_ExprBase =
       (_func_int **)&PTR__Apply_00d70d88;
  (this->
  super_Apply<vkt::shaderexecutor::Signature<tcu::Matrix<float,_2,_2>,_tcu::Matrix<float,_2,_2>,_tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  ).m_func = func;
  Tuple4<vkt::shaderexecutor::ExprP<tcu::Matrix<float,_2,_2>_>,_vkt::shaderexecutor::ExprP<tcu::Matrix<float,_2,_2>_>,_vkt::shaderexecutor::ExprP<vkt::shaderexecutor::Void>,_vkt::shaderexecutor::ExprP<vkt::shaderexecutor::Void>_>
  ::Tuple4(&(this->
            super_Apply<vkt::shaderexecutor::Signature<tcu::Matrix<float,_2,_2>,_tcu::Matrix<float,_2,_2>,_tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
            ).m_args,&local_38,&local_48,&local_58,&local_68);
  if (local_68.super_ContainerExprPBase<vkt::shaderexecutor::Void>.
      super_ExprPBase<vkt::shaderexecutor::Void>.
      super_SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_>.m_state !=
      (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_68.super_ContainerExprPBase<vkt::shaderexecutor::Void>.
               super_ExprPBase<vkt::shaderexecutor::Void>.
               super_SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_>.m_state)
              ->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_68.super_ContainerExprPBase<vkt::shaderexecutor::Void>.
      super_ExprPBase<vkt::shaderexecutor::Void>.
      super_SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_>.m_ptr =
           (Expr<vkt::shaderexecutor::Void> *)0x0;
      (*(local_68.super_ContainerExprPBase<vkt::shaderexecutor::Void>.
         super_ExprPBase<vkt::shaderexecutor::Void>.
         super_SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_>.m_state)->
        _vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_68.super_ContainerExprPBase<vkt::shaderexecutor::Void>.
               super_ExprPBase<vkt::shaderexecutor::Void>.
               super_SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_>.m_state)
              ->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_68.super_ContainerExprPBase<vkt::shaderexecutor::Void>.
          super_ExprPBase<vkt::shaderexecutor::Void>.
          super_SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_>.m_state !=
          (SharedPtrStateBase *)0x0) {
        (*(local_68.super_ContainerExprPBase<vkt::shaderexecutor::Void>.
           super_ExprPBase<vkt::shaderexecutor::Void>.
           super_SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_>.m_state)->
          _vptr_SharedPtrStateBase[1])();
      }
      local_68.super_ContainerExprPBase<vkt::shaderexecutor::Void>.
      super_ExprPBase<vkt::shaderexecutor::Void>.
      super_SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_>.m_state =
           (SharedPtrStateBase *)0x0;
    }
  }
  if (local_58.super_ContainerExprPBase<vkt::shaderexecutor::Void>.
      super_ExprPBase<vkt::shaderexecutor::Void>.
      super_SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_>.m_state !=
      (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_58.super_ContainerExprPBase<vkt::shaderexecutor::Void>.
               super_ExprPBase<vkt::shaderexecutor::Void>.
               super_SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_>.m_state)
              ->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_58.super_ContainerExprPBase<vkt::shaderexecutor::Void>.
      super_ExprPBase<vkt::shaderexecutor::Void>.
      super_SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_>.m_ptr =
           (Expr<vkt::shaderexecutor::Void> *)0x0;
      (*(local_58.super_ContainerExprPBase<vkt::shaderexecutor::Void>.
         super_ExprPBase<vkt::shaderexecutor::Void>.
         super_SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_>.m_state)->
        _vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_58.super_ContainerExprPBase<vkt::shaderexecutor::Void>.
               super_ExprPBase<vkt::shaderexecutor::Void>.
               super_SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_>.m_state)
              ->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_58.super_ContainerExprPBase<vkt::shaderexecutor::Void>.
          super_ExprPBase<vkt::shaderexecutor::Void>.
          super_SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_>.m_state !=
          (SharedPtrStateBase *)0x0) {
        (*(local_58.super_ContainerExprPBase<vkt::shaderexecutor::Void>.
           super_ExprPBase<vkt::shaderexecutor::Void>.
           super_SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_>.m_state)->
          _vptr_SharedPtrStateBase[1])();
      }
      local_58.super_ContainerExprPBase<vkt::shaderexecutor::Void>.
      super_ExprPBase<vkt::shaderexecutor::Void>.
      super_SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_>.m_state =
           (SharedPtrStateBase *)0x0;
    }
  }
  if (local_48.super_ContainerExprPBase<tcu::Matrix<float,_2,_2>_>.
      super_ExprPBase<tcu::Matrix<float,_2,_2>_>.
      super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_2,_2>_>_>.m_state !=
      (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_48.super_ContainerExprPBase<tcu::Matrix<float,_2,_2>_>.
               super_ExprPBase<tcu::Matrix<float,_2,_2>_>.
               super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_2,_2>_>_>.m_state)
              ->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_48.super_ContainerExprPBase<tcu::Matrix<float,_2,_2>_>.
      super_ExprPBase<tcu::Matrix<float,_2,_2>_>.
      super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_2,_2>_>_>.m_ptr =
           (Expr<tcu::Matrix<float,_2,_2>_> *)0x0;
      (*(local_48.super_ContainerExprPBase<tcu::Matrix<float,_2,_2>_>.
         super_ExprPBase<tcu::Matrix<float,_2,_2>_>.
         super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_2,_2>_>_>.m_state)->
        _vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_48.super_ContainerExprPBase<tcu::Matrix<float,_2,_2>_>.
               super_ExprPBase<tcu::Matrix<float,_2,_2>_>.
               super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_2,_2>_>_>.m_state)
              ->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_48.super_ContainerExprPBase<tcu::Matrix<float,_2,_2>_>.
          super_ExprPBase<tcu::Matrix<float,_2,_2>_>.
          super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_2,_2>_>_>.m_state !=
          (SharedPtrStateBase *)0x0) {
        (*(local_48.super_ContainerExprPBase<tcu::Matrix<float,_2,_2>_>.
           super_ExprPBase<tcu::Matrix<float,_2,_2>_>.
           super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_2,_2>_>_>.m_state)->
          _vptr_SharedPtrStateBase[1])();
      }
      local_48.super_ContainerExprPBase<tcu::Matrix<float,_2,_2>_>.
      super_ExprPBase<tcu::Matrix<float,_2,_2>_>.
      super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_2,_2>_>_>.m_state =
           (SharedPtrStateBase *)0x0;
    }
  }
  if (local_38.super_ContainerExprPBase<tcu::Matrix<float,_2,_2>_>.
      super_ExprPBase<tcu::Matrix<float,_2,_2>_>.
      super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_2,_2>_>_>.m_state !=
      (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_38.super_ContainerExprPBase<tcu::Matrix<float,_2,_2>_>.
               super_ExprPBase<tcu::Matrix<float,_2,_2>_>.
               super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_2,_2>_>_>.m_state)
              ->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_38.super_ContainerExprPBase<tcu::Matrix<float,_2,_2>_>.
      super_ExprPBase<tcu::Matrix<float,_2,_2>_>.
      super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_2,_2>_>_>.m_ptr =
           (Expr<tcu::Matrix<float,_2,_2>_> *)0x0;
      (*(local_38.super_ContainerExprPBase<tcu::Matrix<float,_2,_2>_>.
         super_ExprPBase<tcu::Matrix<float,_2,_2>_>.
         super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_2,_2>_>_>.m_state)->
        _vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_38.super_ContainerExprPBase<tcu::Matrix<float,_2,_2>_>.
               super_ExprPBase<tcu::Matrix<float,_2,_2>_>.
               super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_2,_2>_>_>.m_state)
              ->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) &&
       (local_38.super_ContainerExprPBase<tcu::Matrix<float,_2,_2>_>.
        super_ExprPBase<tcu::Matrix<float,_2,_2>_>.
        super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_2,_2>_>_>.m_state !=
        (SharedPtrStateBase *)0x0)) {
      (*(local_38.super_ContainerExprPBase<tcu::Matrix<float,_2,_2>_>.
         super_ExprPBase<tcu::Matrix<float,_2,_2>_>.
         super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_2,_2>_>_>.m_state)->
        _vptr_SharedPtrStateBase[1])();
    }
  }
  (this->
  super_Apply<vkt::shaderexecutor::Signature<tcu::Matrix<float,_2,_2>,_tcu::Matrix<float,_2,_2>,_tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  ).super_Expr<tcu::Matrix<float,_2,_2>_>.super_ExprBase._vptr_ExprBase =
       (_func_int **)&PTR__Apply_00d70d20;
  return;
}

Assistant:

ApplyVar	(const ApplyFunc&			func,
									 const VariableP<Arg0>&		arg0,
									 const VariableP<Arg1>&		arg1,
									 const VariableP<Arg2>&		arg2,
									 const VariableP<Arg3>&		arg3)
							: Apply<Sig> (func, arg0, arg1, arg2, arg3) {}